

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void hash_element_dtor(void *user,void *element)

{
  if (*(long *)((long)element + 0x18) != 0) {
    (**(code **)((long)user + 0x18))();
    *(undefined8 *)((long)element + 0x18) = 0;
  }
  *(undefined8 *)((long)element + 0x20) = 0;
  (*Curl_cfree)(element);
  return;
}

Assistant:

static void
hash_element_dtor(void *user, void *element)
{
  struct curl_hash *h = (struct curl_hash *) user;
  struct curl_hash_element *e = (struct curl_hash_element *) element;

  if(e->ptr) {
    h->dtor(e->ptr);
    e->ptr = NULL;
  }

  e->key_len = 0;

  free(e);
}